

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streambuf.c
# Opt level: O2

void quicly_sendbuf_emit(quicly_stream_t *stream,quicly_sendbuf_t *sb,size_t off,void *dst,
                        size_t *len,int *wrote_all)

{
  quicly_sendbuf_vec_t *pqVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  undefined8 *puVar8;
  ulong uVar9;
  ulong uVar10;
  
  lVar7 = 0;
  uVar9 = 0;
  uVar6 = off + sb->off_in_first_vec;
  uVar4 = *len;
  do {
    if (uVar4 == 0) {
LAB_001210fa:
      uVar4 = 0;
      iVar2 = 0;
      if ((sb->vecs).size <= uVar9) {
LAB_00121102:
        *len = *len - uVar4;
        iVar2 = 1;
      }
      *wrote_all = iVar2;
      return;
    }
    if ((sb->vecs).size <= uVar9) goto LAB_00121102;
    pqVar1 = (sb->vecs).entries;
    uVar10 = *(ulong *)((long)&pqVar1->len + lVar7);
    uVar5 = uVar6 - uVar10;
    uVar3 = uVar4;
    if (uVar6 < uVar10) {
      puVar8 = (undefined8 *)((long)&pqVar1->cb + lVar7);
      uVar10 = uVar10 - uVar6;
      uVar6 = uVar10;
      if (uVar4 < uVar10) {
        uVar6 = uVar4;
      }
      iVar2 = (**(code **)*puVar8)(puVar8,dst);
      if (iVar2 != 0) {
        convert_error(stream,iVar2);
        return;
      }
      uVar3 = uVar4 - uVar6;
      if (uVar4 < uVar10) {
        uVar4 = uVar3;
        if (uVar3 != 0) goto LAB_00121102;
        goto LAB_001210fa;
      }
      dst = (void *)((long)dst + uVar6);
      uVar5 = 0;
    }
    uVar9 = uVar9 + 1;
    lVar7 = lVar7 + 0x18;
    uVar6 = uVar5;
    uVar4 = uVar3;
  } while( true );
}

Assistant:

void quicly_sendbuf_emit(quicly_stream_t *stream, quicly_sendbuf_t *sb, size_t off, void *dst, size_t *len, int *wrote_all)
{
    size_t vec_index, capacity = *len;
    int ret;

    off += sb->off_in_first_vec;
    for (vec_index = 0; capacity != 0 && vec_index < sb->vecs.size; ++vec_index) {
        quicly_sendbuf_vec_t *vec = sb->vecs.entries + vec_index;
        if (off < vec->len) {
            size_t bytes_flatten = vec->len - off;
            int partial = 0;
            if (capacity < bytes_flatten) {
                bytes_flatten = capacity;
                partial = 1;
            }
            if ((ret = vec->cb->flatten_vec(vec, dst, off, bytes_flatten)) != 0) {
                convert_error(stream, ret);
                return;
            }
            dst = (uint8_t *)dst + bytes_flatten;
            capacity -= bytes_flatten;
            off = 0;
            if (partial)
                break;
        } else {
            off -= vec->len;
        }
    }

    if (capacity == 0 && vec_index < sb->vecs.size) {
        *wrote_all = 0;
    } else {
        *len = *len - capacity;
        *wrote_all = 1;
    }
}